

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Utility.cpp
# Opt level: O3

Vector<char,_std::allocator<char>_> *
amrex::SerializeStringArray
          (Vector<char,_std::allocator<char>_> *__return_storage_ptr__,
          Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *stringArray)

{
  pointer pbVar1;
  char *__dest;
  long *__src;
  pointer pbVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  ostringstream stringStream;
  allocator_type local_1c9;
  char local_1c8;
  undefined7 uStack_1c7;
  long local_1c0;
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  pbVar2 = (stringArray->
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (stringArray->
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar1 != pbVar2 && -1 < (long)pbVar1 - (long)pbVar2) {
    lVar5 = 8;
    lVar4 = 0;
    do {
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,*(char **)((long)pbVar2 + lVar5 + -8),
                          *(long *)((long)&(pbVar2->_M_dataplus)._M_p + lVar5));
      local_1c8 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_1c8,1);
      lVar4 = lVar4 + 1;
      pbVar2 = (stringArray->
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x20;
    } while (lVar4 < (long)(stringArray->
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5);
  }
  std::__cxx11::stringbuf::str();
  std::vector<char,_std::allocator<char>_>::vector
            (&__return_storage_ptr__->super_vector<char,_std::allocator<char>_>,local_1c0 + 1,
             &local_1c9);
  if ((long *)CONCAT71(uStack_1c7,local_1c8) != local_1b8) {
    operator_delete((long *)CONCAT71(uStack_1c7,local_1c8),local_1b8[0] + 1);
  }
  __dest = (__return_storage_ptr__->super_vector<char,_std::allocator<char>_>).
           super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::stringbuf::str();
  __src = (long *)CONCAT71(uStack_1c7,local_1c8);
  strcpy(__dest,(char *)__src);
  if (__src != local_1b8) {
    operator_delete(__src,local_1b8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

amrex::Vector<char> amrex::SerializeStringArray(const Vector<std::string> &stringArray)
{
  std::ostringstream stringStream;
  for(int i(0); i < stringArray.size(); ++i) {
    stringStream << stringArray[i] << '\n';
  }

  Vector<char> charArray(stringStream.str().size() + 1);
  std::strcpy(charArray.dataPtr(), stringStream.str().c_str());  // null terminated

  return charArray;
}